

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O3

Port * __thiscall Vault::Client::getPort_abi_cxx11_(Port *__return_storage_ptr__,Client *this)

{
  (__return_storage_ptr__->value_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(this + 0x30),
             *(long *)(this + 0x38) + *(long *)(this + 0x30));
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Port getPort() const { return port_; }